

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::Eltwise_x86_avx::forward
          (Eltwise_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  pointer pMVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  int iVar8;
  Mat *m;
  Mat *this_00;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  void *pvVar12;
  size_t sVar13;
  void *pvVar14;
  size_t sVar15;
  size_t sVar16;
  void *pvVar17;
  _func_int *p_Var18;
  _func_int **pp_Var19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  ulong uVar33;
  pointer pMVar34;
  ulong uVar35;
  ulong uVar36;
  int iVar37;
  ulong uVar38;
  long lVar39;
  long lVar40;
  int iVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  float in_register_0000125c;
  float in_register_0000129c;
  float in_register_000012dc;
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  iVar37 = m->elempack;
  uVar7 = m->c;
  uVar35 = (ulong)uVar7;
  iVar41 = m->h * m->w;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,m,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep != 0) {
    iVar8 = *(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86_avx[-3]);
    if (iVar37 == 4) {
      if (iVar8 == 0) {
        if (0 < (int)uVar7) {
          pMVar34 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          uVar33 = 0;
          do {
            if (0 < iVar41) {
              sVar9 = this_00->cstep;
              sVar10 = pMVar34[1].cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar34[1].elemsize;
              pvVar14 = pMVar34[1].data;
              sVar15 = m->cstep;
              sVar16 = m->elemsize;
              pvVar17 = m->data;
              lVar39 = 0;
              iVar37 = iVar41;
              do {
                pfVar1 = (float *)((long)pvVar14 + lVar39 + sVar10 * sVar13 * uVar33);
                pfVar2 = (float *)((long)pvVar17 + lVar39 + sVar15 * sVar16 * uVar33);
                auVar42._0_4_ = *pfVar1 * *pfVar2;
                auVar42._4_4_ = pfVar1[1] * pfVar2[1];
                auVar42._8_4_ = pfVar1[2] * pfVar2[2];
                auVar42._12_4_ = pfVar1[3] * pfVar2[3];
                *(undefined1 (*) [16])((long)pvVar12 + lVar39 + sVar9 * sVar11 * uVar33) = auVar42;
                lVar39 = lVar39 + 0x10;
                iVar37 = iVar37 + -1;
              } while (iVar37 != 0);
            }
            uVar33 = uVar33 + 1;
          } while (uVar33 != uVar35);
        }
        pMVar34 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (2 < (ulong)(((long)(bottom_blobs->
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pMVar34 >> 3) *
                       -0x71c71c71c71c71c7)) {
          uVar33 = 2;
          do {
            if (0 < (int)uVar7) {
              pMVar34 = pMVar34 + uVar33;
              uVar36 = 0;
              do {
                if (0 < iVar41) {
                  lVar39 = this_00->cstep * this_00->elemsize * uVar36;
                  pvVar12 = this_00->data;
                  sVar9 = pMVar34->cstep;
                  sVar10 = pMVar34->elemsize;
                  pvVar14 = pMVar34->data;
                  lVar40 = 0;
                  iVar37 = iVar41;
                  do {
                    pfVar1 = (float *)((long)pvVar14 + lVar40 + sVar9 * sVar10 * uVar36);
                    pfVar2 = (float *)((long)pvVar12 + lVar40 + lVar39);
                    auVar43._0_4_ = *pfVar1 * *pfVar2;
                    auVar43._4_4_ = pfVar1[1] * pfVar2[1];
                    auVar43._8_4_ = pfVar1[2] * pfVar2[2];
                    auVar43._12_4_ = pfVar1[3] * pfVar2[3];
                    *(undefined1 (*) [16])((long)pvVar12 + lVar40 + lVar39) = auVar43;
                    lVar40 = lVar40 + 0x10;
                    iVar37 = iVar37 + -1;
                  } while (iVar37 != 0);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar35);
            }
            uVar33 = uVar33 + 1;
            pMVar34 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
          } while (uVar33 < (ulong)(((long)(bottom_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pMVar34 >> 3) * -0x71c71c71c71c71c7));
        }
      }
      p_Var18 = this->_vptr_Eltwise_x86_avx[-3];
      if (*(int *)(&this->field_0xd0 + (long)p_Var18) == 1) {
        pMVar34 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (*(int *)(&this->field_0x104 + (long)p_Var18) == 0) {
          if (0 < (int)uVar7) {
            uVar33 = 0;
            do {
              if (0 < iVar41) {
                sVar9 = this_00->cstep;
                sVar10 = pMVar34[1].cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar34[1].elemsize;
                pvVar14 = pMVar34[1].data;
                sVar15 = m->cstep;
                sVar16 = m->elemsize;
                pvVar17 = m->data;
                lVar39 = 0;
                iVar37 = iVar41;
                do {
                  pfVar1 = (float *)((long)pvVar14 + lVar39 + sVar10 * sVar13 * uVar33);
                  pfVar2 = (float *)((long)pvVar17 + lVar39 + sVar15 * sVar16 * uVar33);
                  auVar44._0_4_ = *pfVar1 + *pfVar2;
                  auVar44._4_4_ = pfVar1[1] + pfVar2[1];
                  auVar44._8_4_ = pfVar1[2] + pfVar2[2];
                  auVar44._12_4_ = pfVar1[3] + pfVar2[3];
                  *(undefined1 (*) [16])((long)pvVar12 + lVar39 + sVar9 * sVar11 * uVar33) = auVar44
                  ;
                  lVar39 = lVar39 + 0x10;
                  iVar37 = iVar37 + -1;
                } while (iVar37 != 0);
              }
              uVar33 = uVar33 + 1;
            } while (uVar33 != uVar35);
          }
          pMVar34 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          if (2 < (ulong)(((long)(bottom_blobs->
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pMVar34 >> 3) *
                         -0x71c71c71c71c71c7)) {
            uVar33 = 2;
            do {
              if (0 < (int)uVar7) {
                pMVar34 = pMVar34 + uVar33;
                uVar36 = 0;
                do {
                  if (0 < iVar41) {
                    lVar39 = this_00->cstep * this_00->elemsize * uVar36;
                    pvVar12 = this_00->data;
                    sVar9 = pMVar34->cstep;
                    sVar10 = pMVar34->elemsize;
                    pvVar14 = pMVar34->data;
                    lVar40 = 0;
                    iVar37 = iVar41;
                    do {
                      pfVar1 = (float *)((long)pvVar14 + lVar40 + sVar9 * sVar10 * uVar36);
                      pfVar2 = (float *)((long)pvVar12 + lVar40 + lVar39);
                      auVar45._0_4_ = *pfVar1 + *pfVar2;
                      auVar45._4_4_ = pfVar1[1] + pfVar2[1];
                      auVar45._8_4_ = pfVar1[2] + pfVar2[2];
                      auVar45._12_4_ = pfVar1[3] + pfVar2[3];
                      *(undefined1 (*) [16])((long)pvVar12 + lVar40 + lVar39) = auVar45;
                      lVar40 = lVar40 + 0x10;
                      iVar37 = iVar37 + -1;
                    } while (iVar37 != 0);
                  }
                  uVar36 = uVar36 + 1;
                } while (uVar36 != uVar35);
              }
              uVar33 = uVar33 + 1;
              pMVar34 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start;
            } while (uVar33 < (ulong)(((long)(bottom_blobs->
                                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pMVar34 >> 3) * -0x71c71c71c71c71c7));
          }
        }
        else {
          if (0 < (int)uVar7) {
            fVar5 = **(float **)(&this->field_0xd8 + (long)p_Var18);
            fVar6 = (*(float **)(&this->field_0xd8 + (long)p_Var18))[1];
            uVar33 = 0;
            do {
              if (0 < iVar41) {
                sVar9 = this_00->cstep;
                sVar10 = pMVar34[1].cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar34[1].elemsize;
                pvVar14 = pMVar34[1].data;
                sVar15 = m->cstep;
                sVar16 = m->elemsize;
                pvVar17 = m->data;
                lVar39 = 0;
                iVar37 = iVar41;
                do {
                  pfVar1 = (float *)((long)pvVar17 + lVar39 + sVar15 * sVar16 * uVar33);
                  fVar22 = pfVar1[1];
                  fVar23 = pfVar1[2];
                  fVar24 = pfVar1[3];
                  pfVar2 = (float *)((long)pvVar14 + lVar39 + sVar10 * sVar13 * uVar33);
                  fVar25 = pfVar2[1];
                  fVar26 = pfVar2[2];
                  fVar27 = pfVar2[3];
                  pfVar3 = (float *)((long)pvVar12 + lVar39 + sVar9 * sVar11 * uVar33);
                  *pfVar3 = fVar6 * *pfVar2 + fVar5 * *pfVar1;
                  pfVar3[1] = fVar6 * fVar25 + fVar5 * fVar22;
                  pfVar3[2] = fVar6 * fVar26 + fVar5 * fVar23;
                  pfVar3[3] = fVar6 * fVar27 + fVar5 * fVar24;
                  lVar39 = lVar39 + 0x10;
                  iVar37 = iVar37 + -1;
                } while (iVar37 != 0);
              }
              uVar33 = uVar33 + 1;
            } while (uVar33 != uVar35);
          }
          pMVar34 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          if (2 < (ulong)(((long)(bottom_blobs->
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pMVar34 >> 3) *
                         -0x71c71c71c71c71c7)) {
            pp_Var19 = this->_vptr_Eltwise_x86_avx;
            uVar33 = 2;
            do {
              if (0 < (int)uVar7) {
                pMVar34 = pMVar34 + uVar33;
                fVar5 = *(float *)(*(long *)(&this->field_0xd8 + (long)pp_Var19[-3]) + uVar33 * 4);
                uVar36 = 0;
                do {
                  if (0 < iVar41) {
                    lVar39 = this_00->cstep * this_00->elemsize * uVar36;
                    pvVar12 = this_00->data;
                    sVar9 = pMVar34->cstep;
                    sVar10 = pMVar34->elemsize;
                    pvVar14 = pMVar34->data;
                    lVar40 = 0;
                    iVar37 = iVar41;
                    do {
                      pfVar1 = (float *)((long)pvVar14 + lVar40 + sVar9 * sVar10 * uVar36);
                      fVar6 = pfVar1[1];
                      fVar22 = pfVar1[2];
                      fVar23 = pfVar1[3];
                      pfVar2 = (float *)((long)pvVar12 + lVar40 + lVar39);
                      fVar24 = pfVar2[1];
                      fVar25 = pfVar2[2];
                      fVar26 = pfVar2[3];
                      pfVar3 = (float *)((long)pvVar12 + lVar40 + lVar39);
                      *pfVar3 = fVar5 * *pfVar1 + *pfVar2;
                      pfVar3[1] = fVar5 * fVar6 + fVar24;
                      pfVar3[2] = fVar5 * fVar22 + fVar25;
                      pfVar3[3] = fVar5 * fVar23 + fVar26;
                      lVar40 = lVar40 + 0x10;
                      iVar37 = iVar37 + -1;
                    } while (iVar37 != 0);
                  }
                  uVar36 = uVar36 + 1;
                } while (uVar36 != uVar35);
              }
              uVar33 = uVar33 + 1;
              pMVar34 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start;
            } while (uVar33 < (ulong)(((long)(bottom_blobs->
                                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pMVar34 >> 3) * -0x71c71c71c71c71c7));
          }
        }
      }
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86_avx[-3]) != 2) {
        return 0;
      }
      if (0 < (int)uVar7) {
        pMVar34 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar33 = 0;
        do {
          if (0 < iVar41) {
            sVar9 = this_00->cstep;
            sVar10 = pMVar34[1].cstep;
            sVar11 = this_00->elemsize;
            pvVar12 = this_00->data;
            sVar13 = pMVar34[1].elemsize;
            pvVar14 = pMVar34[1].data;
            sVar15 = m->cstep;
            sVar16 = m->elemsize;
            pvVar17 = m->data;
            lVar39 = 0;
            iVar37 = iVar41;
            do {
              auVar42 = vmaxps_avx(*(undefined1 (*) [16])
                                    ((long)pvVar17 + lVar39 + sVar15 * sVar16 * uVar33),
                                   *(undefined1 (*) [16])
                                    ((long)pvVar14 + lVar39 + sVar10 * sVar13 * uVar33));
              *(undefined1 (*) [16])((long)pvVar12 + lVar39 + sVar9 * sVar11 * uVar33) = auVar42;
              lVar39 = lVar39 + 0x10;
              iVar37 = iVar37 + -1;
            } while (iVar37 != 0);
          }
          uVar33 = uVar33 + 1;
        } while (uVar33 != uVar35);
      }
      pMVar34 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)(((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pMVar34 >> 3) *
                 -0x71c71c71c71c71c7) < 3) {
        return 0;
      }
      uVar33 = 2;
      do {
        if (0 < (int)uVar7) {
          pMVar34 = pMVar34 + uVar33;
          uVar36 = 0;
          do {
            if (0 < iVar41) {
              lVar39 = this_00->cstep * this_00->elemsize * uVar36;
              pvVar12 = this_00->data;
              sVar9 = pMVar34->cstep;
              sVar10 = pMVar34->elemsize;
              pvVar14 = pMVar34->data;
              lVar40 = 0;
              iVar37 = iVar41;
              do {
                auVar42 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar12 + lVar40 + lVar39),
                                     *(undefined1 (*) [16])
                                      ((long)pvVar14 + lVar40 + sVar9 * sVar10 * uVar36));
                *(undefined1 (*) [16])((long)pvVar12 + lVar40 + lVar39) = auVar42;
                lVar40 = lVar40 + 0x10;
                iVar37 = iVar37 + -1;
              } while (iVar37 != 0);
            }
            uVar36 = uVar36 + 1;
          } while (uVar36 != uVar35);
        }
        uVar33 = uVar33 + 1;
        pMVar34 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar33 < (ulong)(((long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar34 >>
                                3) * -0x71c71c71c71c71c7));
    }
    else if (iVar37 == 8) {
      if (iVar8 == 0) {
        if (0 < (int)uVar7) {
          pMVar34 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          uVar33 = 0;
          do {
            if (0 < iVar41) {
              sVar9 = pMVar34[1].cstep;
              sVar10 = m->cstep;
              sVar11 = m->elemsize;
              pvVar12 = m->data;
              sVar13 = pMVar34[1].elemsize;
              pvVar14 = pMVar34[1].data;
              sVar15 = this_00->cstep;
              sVar16 = this_00->elemsize;
              pvVar17 = this_00->data;
              lVar39 = 0;
              iVar37 = iVar41;
              do {
                pfVar1 = (float *)((long)pvVar14 + lVar39 + sVar9 * sVar13 * uVar33);
                pfVar2 = (float *)((long)pvVar12 + lVar39 + sVar10 * sVar11 * uVar33);
                auVar20._4_4_ = pfVar1[1] * pfVar2[1];
                auVar20._0_4_ = *pfVar1 * *pfVar2;
                auVar20._8_4_ = pfVar1[2] * pfVar2[2];
                auVar20._12_4_ = pfVar1[3] * pfVar2[3];
                auVar20._16_4_ = pfVar1[4] * pfVar2[4];
                auVar20._20_4_ = pfVar1[5] * pfVar2[5];
                auVar20._24_4_ = pfVar1[6] * pfVar2[6];
                auVar20._28_4_ = pfVar1[7];
                *(undefined1 (*) [32])((long)pvVar17 + lVar39 + sVar15 * sVar16 * uVar33) = auVar20;
                lVar39 = lVar39 + 0x20;
                iVar37 = iVar37 + -1;
              } while (iVar37 != 0);
            }
            uVar33 = uVar33 + 1;
          } while (uVar33 != uVar35);
        }
        pMVar34 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (2 < (ulong)(((long)(bottom_blobs->
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pMVar34 >> 3) *
                       -0x71c71c71c71c71c7)) {
          uVar33 = 2;
          do {
            if (0 < (int)uVar7) {
              pMVar34 = pMVar34 + uVar33;
              uVar36 = 0;
              do {
                if (0 < iVar41) {
                  sVar9 = pMVar34->cstep;
                  sVar10 = pMVar34->elemsize;
                  pvVar12 = pMVar34->data;
                  lVar39 = this_00->cstep * this_00->elemsize * uVar36;
                  pvVar14 = this_00->data;
                  lVar40 = 0;
                  iVar37 = iVar41;
                  do {
                    pfVar1 = (float *)((long)pvVar12 + lVar40 + sVar9 * sVar10 * uVar36);
                    pfVar2 = (float *)((long)pvVar14 + lVar40 + lVar39);
                    auVar21._4_4_ = pfVar1[1] * pfVar2[1];
                    auVar21._0_4_ = *pfVar1 * *pfVar2;
                    auVar21._8_4_ = pfVar1[2] * pfVar2[2];
                    auVar21._12_4_ = pfVar1[3] * pfVar2[3];
                    auVar21._16_4_ = pfVar1[4] * pfVar2[4];
                    auVar21._20_4_ = pfVar1[5] * pfVar2[5];
                    auVar21._24_4_ = pfVar1[6] * pfVar2[6];
                    auVar21._28_4_ = pfVar1[7];
                    *(undefined1 (*) [32])((long)pvVar14 + lVar40 + lVar39) = auVar21;
                    lVar40 = lVar40 + 0x20;
                    iVar37 = iVar37 + -1;
                  } while (iVar37 != 0);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar35);
            }
            uVar33 = uVar33 + 1;
            pMVar34 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
          } while (uVar33 < (ulong)(((long)(bottom_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pMVar34 >> 3) * -0x71c71c71c71c71c7));
        }
      }
      p_Var18 = this->_vptr_Eltwise_x86_avx[-3];
      if (*(int *)(&this->field_0xd0 + (long)p_Var18) == 1) {
        pMVar34 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (*(int *)(&this->field_0x104 + (long)p_Var18) == 0) {
          if (0 < (int)uVar7) {
            uVar33 = 0;
            do {
              if (0 < iVar41) {
                sVar9 = pMVar34[1].cstep;
                sVar10 = m->cstep;
                sVar11 = m->elemsize;
                pvVar12 = m->data;
                sVar13 = pMVar34[1].elemsize;
                pvVar14 = pMVar34[1].data;
                sVar15 = this_00->cstep;
                sVar16 = this_00->elemsize;
                pvVar17 = this_00->data;
                lVar39 = 0;
                iVar37 = iVar41;
                do {
                  pfVar1 = (float *)((long)pvVar14 + lVar39 + sVar9 * sVar13 * uVar33);
                  pfVar2 = (float *)((long)pvVar12 + lVar39 + sVar10 * sVar11 * uVar33);
                  auVar46._0_4_ = *pfVar1 + *pfVar2;
                  auVar46._4_4_ = pfVar1[1] + pfVar2[1];
                  auVar46._8_4_ = pfVar1[2] + pfVar2[2];
                  auVar46._12_4_ = pfVar1[3] + pfVar2[3];
                  auVar46._16_4_ = pfVar1[4] + pfVar2[4];
                  auVar46._20_4_ = pfVar1[5] + pfVar2[5];
                  auVar46._24_4_ = pfVar1[6] + pfVar2[6];
                  auVar46._28_4_ = pfVar1[7] + pfVar2[7];
                  *(undefined1 (*) [32])((long)pvVar17 + lVar39 + sVar15 * sVar16 * uVar33) =
                       auVar46;
                  lVar39 = lVar39 + 0x20;
                  iVar37 = iVar37 + -1;
                } while (iVar37 != 0);
              }
              uVar33 = uVar33 + 1;
            } while (uVar33 != uVar35);
          }
          pMVar34 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          if (2 < (ulong)(((long)(bottom_blobs->
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pMVar34 >> 3) *
                         -0x71c71c71c71c71c7)) {
            uVar33 = 2;
            do {
              if (0 < (int)uVar7) {
                pMVar34 = pMVar34 + uVar33;
                uVar36 = 0;
                do {
                  if (0 < iVar41) {
                    sVar9 = pMVar34->cstep;
                    sVar10 = pMVar34->elemsize;
                    pvVar12 = pMVar34->data;
                    lVar39 = this_00->cstep * this_00->elemsize * uVar36;
                    pvVar14 = this_00->data;
                    lVar40 = 0;
                    iVar37 = iVar41;
                    do {
                      pfVar1 = (float *)((long)pvVar12 + lVar40 + sVar9 * sVar10 * uVar36);
                      pfVar2 = (float *)((long)pvVar14 + lVar40 + lVar39);
                      auVar47._0_4_ = *pfVar1 + *pfVar2;
                      auVar47._4_4_ = pfVar1[1] + pfVar2[1];
                      auVar47._8_4_ = pfVar1[2] + pfVar2[2];
                      auVar47._12_4_ = pfVar1[3] + pfVar2[3];
                      auVar47._16_4_ = pfVar1[4] + pfVar2[4];
                      auVar47._20_4_ = pfVar1[5] + pfVar2[5];
                      auVar47._24_4_ = pfVar1[6] + pfVar2[6];
                      auVar47._28_4_ = pfVar1[7] + pfVar2[7];
                      *(undefined1 (*) [32])((long)pvVar14 + lVar40 + lVar39) = auVar47;
                      lVar40 = lVar40 + 0x20;
                      iVar37 = iVar37 + -1;
                    } while (iVar37 != 0);
                  }
                  uVar36 = uVar36 + 1;
                } while (uVar36 != uVar35);
              }
              uVar33 = uVar33 + 1;
              pMVar34 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start;
            } while (uVar33 < (ulong)(((long)(bottom_blobs->
                                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pMVar34 >> 3) * -0x71c71c71c71c71c7));
          }
        }
        else {
          if (0 < (int)uVar7) {
            fVar5 = **(float **)(&this->field_0xd8 + (long)p_Var18);
            in_register_0000125c = (*(float **)(&this->field_0xd8 + (long)p_Var18))[1];
            uVar33 = 0;
            do {
              if (0 < iVar41) {
                sVar9 = pMVar34[1].cstep;
                sVar10 = m->cstep;
                sVar11 = m->elemsize;
                pvVar12 = m->data;
                sVar13 = pMVar34[1].elemsize;
                pvVar14 = pMVar34[1].data;
                sVar15 = this_00->cstep;
                sVar16 = this_00->elemsize;
                pvVar17 = this_00->data;
                lVar39 = 0;
                iVar37 = iVar41;
                do {
                  pfVar1 = (float *)((long)pvVar12 + lVar39 + sVar10 * sVar11 * uVar33);
                  fVar6 = pfVar1[1];
                  fVar22 = pfVar1[2];
                  fVar23 = pfVar1[3];
                  fVar24 = pfVar1[4];
                  fVar25 = pfVar1[5];
                  fVar26 = pfVar1[6];
                  pfVar2 = (float *)((long)pvVar14 + lVar39 + sVar9 * sVar13 * uVar33);
                  fVar27 = pfVar2[1];
                  fVar28 = pfVar2[2];
                  fVar29 = pfVar2[3];
                  fVar30 = pfVar2[4];
                  fVar31 = pfVar2[5];
                  fVar32 = pfVar2[6];
                  in_register_0000129c = in_register_000012dc + in_register_0000129c;
                  pfVar3 = (float *)((long)pvVar17 + lVar39 + sVar15 * sVar16 * uVar33);
                  *pfVar3 = in_register_0000125c * *pfVar2 + fVar5 * *pfVar1;
                  pfVar3[1] = in_register_0000125c * fVar27 + fVar5 * fVar6;
                  pfVar3[2] = in_register_0000125c * fVar28 + fVar5 * fVar22;
                  pfVar3[3] = in_register_0000125c * fVar29 + fVar5 * fVar23;
                  pfVar3[4] = in_register_0000125c * fVar30 + fVar5 * fVar24;
                  pfVar3[5] = in_register_0000125c * fVar31 + fVar5 * fVar25;
                  pfVar3[6] = in_register_0000125c * fVar32 + fVar5 * fVar26;
                  pfVar3[7] = in_register_0000129c;
                  lVar39 = lVar39 + 0x20;
                  iVar37 = iVar37 + -1;
                } while (iVar37 != 0);
              }
              uVar33 = uVar33 + 1;
            } while (uVar33 != uVar35);
          }
          pMVar34 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          if (2 < (ulong)(((long)(bottom_blobs->
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pMVar34 >> 3) *
                         -0x71c71c71c71c71c7)) {
            pp_Var19 = this->_vptr_Eltwise_x86_avx;
            uVar33 = 2;
            do {
              if (0 < (int)uVar7) {
                pMVar34 = pMVar34 + uVar33;
                fVar5 = *(float *)(*(long *)(&this->field_0xd8 + (long)pp_Var19[-3]) + uVar33 * 4);
                uVar36 = 0;
                do {
                  if (0 < iVar41) {
                    sVar9 = pMVar34->cstep;
                    sVar10 = pMVar34->elemsize;
                    pvVar12 = pMVar34->data;
                    lVar39 = this_00->cstep * this_00->elemsize * uVar36;
                    pvVar14 = this_00->data;
                    lVar40 = 0;
                    iVar37 = iVar41;
                    do {
                      pfVar1 = (float *)((long)pvVar12 + lVar40 + sVar9 * sVar10 * uVar36);
                      fVar6 = pfVar1[1];
                      fVar22 = pfVar1[2];
                      fVar23 = pfVar1[3];
                      fVar24 = pfVar1[4];
                      fVar25 = pfVar1[5];
                      fVar26 = pfVar1[6];
                      pfVar2 = (float *)((long)pvVar14 + lVar40 + lVar39);
                      fVar27 = pfVar2[1];
                      fVar28 = pfVar2[2];
                      fVar29 = pfVar2[3];
                      fVar30 = pfVar2[4];
                      fVar31 = pfVar2[5];
                      fVar32 = pfVar2[6];
                      in_register_0000125c = in_register_0000125c + pfVar2[7];
                      pfVar3 = (float *)((long)pvVar14 + lVar40 + lVar39);
                      *pfVar3 = fVar5 * *pfVar1 + *pfVar2;
                      pfVar3[1] = fVar5 * fVar6 + fVar27;
                      pfVar3[2] = fVar5 * fVar22 + fVar28;
                      pfVar3[3] = fVar5 * fVar23 + fVar29;
                      pfVar3[4] = fVar5 * fVar24 + fVar30;
                      pfVar3[5] = fVar5 * fVar25 + fVar31;
                      pfVar3[6] = fVar5 * fVar26 + fVar32;
                      pfVar3[7] = in_register_0000125c;
                      lVar40 = lVar40 + 0x20;
                      iVar37 = iVar37 + -1;
                    } while (iVar37 != 0);
                  }
                  uVar36 = uVar36 + 1;
                } while (uVar36 != uVar35);
              }
              uVar33 = uVar33 + 1;
              pMVar34 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start;
            } while (uVar33 < (ulong)(((long)(bottom_blobs->
                                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pMVar34 >> 3) * -0x71c71c71c71c71c7));
          }
        }
      }
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86_avx[-3]) != 2) {
        return 0;
      }
      if (0 < (int)uVar7) {
        pMVar34 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar33 = 0;
        do {
          if (0 < iVar41) {
            sVar9 = pMVar34[1].cstep;
            sVar10 = m->cstep;
            sVar11 = m->elemsize;
            pvVar12 = m->data;
            sVar13 = pMVar34[1].elemsize;
            pvVar14 = pMVar34[1].data;
            sVar15 = this_00->cstep;
            sVar16 = this_00->elemsize;
            pvVar17 = this_00->data;
            lVar39 = 0;
            iVar37 = iVar41;
            do {
              auVar20 = vmaxps_avx(*(undefined1 (*) [32])
                                    ((long)pvVar12 + lVar39 + sVar10 * sVar11 * uVar33),
                                   *(undefined1 (*) [32])
                                    ((long)pvVar14 + lVar39 + sVar9 * sVar13 * uVar33));
              *(undefined1 (*) [32])((long)pvVar17 + lVar39 + sVar15 * sVar16 * uVar33) = auVar20;
              lVar39 = lVar39 + 0x20;
              iVar37 = iVar37 + -1;
            } while (iVar37 != 0);
          }
          uVar33 = uVar33 + 1;
        } while (uVar33 != uVar35);
      }
      pMVar34 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)(((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pMVar34 >> 3) *
                 -0x71c71c71c71c71c7) < 3) {
        return 0;
      }
      uVar33 = 2;
      do {
        if (0 < (int)uVar7) {
          pMVar34 = pMVar34 + uVar33;
          uVar36 = 0;
          do {
            if (0 < iVar41) {
              sVar9 = pMVar34->cstep;
              sVar10 = pMVar34->elemsize;
              pvVar12 = pMVar34->data;
              lVar39 = this_00->cstep * this_00->elemsize * uVar36;
              pvVar14 = this_00->data;
              lVar40 = 0;
              iVar37 = iVar41;
              do {
                auVar20 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar14 + lVar40 + lVar39),
                                     *(undefined1 (*) [32])
                                      ((long)pvVar12 + lVar40 + sVar9 * sVar10 * uVar36));
                *(undefined1 (*) [32])((long)pvVar14 + lVar40 + lVar39) = auVar20;
                lVar40 = lVar40 + 0x20;
                iVar37 = iVar37 + -1;
              } while (iVar37 != 0);
            }
            uVar36 = uVar36 + 1;
          } while (uVar36 != uVar35);
        }
        uVar33 = uVar33 + 1;
        pMVar34 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar33 < (ulong)(((long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar34 >>
                                3) * -0x71c71c71c71c71c7));
    }
    else {
      if (iVar8 == 0) {
        if (0 < (int)uVar7) {
          pMVar34 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          uVar33 = 0;
          do {
            if (0 < iVar41) {
              sVar9 = this_00->cstep;
              sVar10 = pMVar34[1].cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar34[1].elemsize;
              pvVar14 = pMVar34[1].data;
              sVar15 = m->cstep;
              sVar16 = m->elemsize;
              pvVar17 = m->data;
              lVar39 = 0;
              iVar37 = iVar41 + 1;
              do {
                *(float *)((long)pvVar12 + lVar39 + sVar9 * sVar11 * uVar33) =
                     *(float *)((long)pvVar14 + lVar39 + sVar10 * sVar13 * uVar33) *
                     *(float *)((long)pvVar17 + lVar39 + sVar15 * sVar16 * uVar33);
                iVar37 = iVar37 + -1;
                lVar39 = lVar39 + 4;
              } while (1 < iVar37);
            }
            uVar33 = uVar33 + 1;
          } while (uVar33 != uVar35);
        }
        pMVar34 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar33 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar34 >> 3) *
                 -0x71c71c71c71c71c7;
        if (2 < uVar33) {
          uVar36 = 2;
          do {
            if (0 < (int)uVar7) {
              pMVar4 = pMVar34 + uVar36;
              uVar38 = 0;
              do {
                if (0 < iVar41) {
                  lVar39 = this_00->cstep * this_00->elemsize * uVar38;
                  pvVar12 = this_00->data;
                  sVar9 = pMVar4->cstep;
                  sVar10 = pMVar4->elemsize;
                  pvVar14 = pMVar4->data;
                  lVar40 = 0;
                  iVar37 = iVar41 + 1;
                  do {
                    *(float *)((long)pvVar12 + lVar40 + lVar39) =
                         *(float *)((long)pvVar12 + lVar40 + lVar39) *
                         *(float *)((long)pvVar14 + lVar40 + sVar9 * sVar10 * uVar38);
                    iVar37 = iVar37 + -1;
                    lVar40 = lVar40 + 4;
                  } while (1 < iVar37);
                }
                uVar38 = uVar38 + 1;
              } while (uVar38 != uVar35);
            }
            uVar36 = uVar36 + 1;
          } while (uVar36 != uVar33);
        }
      }
      p_Var18 = this->_vptr_Eltwise_x86_avx[-3];
      if (*(int *)(&this->field_0xd0 + (long)p_Var18) == 1) {
        pMVar34 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (*(int *)(&this->field_0x104 + (long)p_Var18) == 0) {
          if (0 < (int)uVar7) {
            uVar33 = 0;
            do {
              if (0 < iVar41) {
                sVar9 = this_00->cstep;
                sVar10 = pMVar34[1].cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar34[1].elemsize;
                pvVar14 = pMVar34[1].data;
                sVar15 = m->cstep;
                sVar16 = m->elemsize;
                pvVar17 = m->data;
                lVar39 = 0;
                iVar37 = iVar41 + 1;
                do {
                  *(float *)((long)pvVar12 + lVar39 + sVar9 * sVar11 * uVar33) =
                       *(float *)((long)pvVar14 + lVar39 + sVar10 * sVar13 * uVar33) +
                       *(float *)((long)pvVar17 + lVar39 + sVar15 * sVar16 * uVar33);
                  iVar37 = iVar37 + -1;
                  lVar39 = lVar39 + 4;
                } while (1 < iVar37);
              }
              uVar33 = uVar33 + 1;
            } while (uVar33 != uVar35);
          }
          pMVar34 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          uVar33 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar34 >> 3) *
                   -0x71c71c71c71c71c7;
          if (2 < uVar33) {
            uVar36 = 2;
            do {
              if (0 < (int)uVar7) {
                pMVar4 = pMVar34 + uVar36;
                uVar38 = 0;
                do {
                  if (0 < iVar41) {
                    lVar39 = this_00->cstep * this_00->elemsize * uVar38;
                    pvVar12 = this_00->data;
                    sVar9 = pMVar4->cstep;
                    sVar10 = pMVar4->elemsize;
                    pvVar14 = pMVar4->data;
                    lVar40 = 0;
                    iVar37 = iVar41 + 1;
                    do {
                      *(float *)((long)pvVar12 + lVar40 + lVar39) =
                           *(float *)((long)pvVar12 + lVar40 + lVar39) +
                           *(float *)((long)pvVar14 + lVar40 + sVar9 * sVar10 * uVar38);
                      iVar37 = iVar37 + -1;
                      lVar40 = lVar40 + 4;
                    } while (1 < iVar37);
                  }
                  uVar38 = uVar38 + 1;
                } while (uVar38 != uVar35);
              }
              uVar36 = uVar36 + 1;
            } while (uVar36 != uVar33);
          }
        }
        else {
          if (0 < (int)uVar7) {
            fVar5 = **(float **)(&this->field_0xd8 + (long)p_Var18);
            fVar6 = (*(float **)(&this->field_0xd8 + (long)p_Var18))[1];
            uVar33 = 0;
            do {
              if (0 < iVar41) {
                sVar9 = this_00->cstep;
                sVar10 = pMVar34[1].cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar34[1].elemsize;
                pvVar14 = pMVar34[1].data;
                sVar15 = m->cstep;
                sVar16 = m->elemsize;
                pvVar17 = m->data;
                lVar39 = 0;
                iVar37 = iVar41 + 1;
                do {
                  *(float *)((long)pvVar12 + lVar39 + sVar9 * sVar11 * uVar33) =
                       fVar6 * *(float *)((long)pvVar14 + lVar39 + sVar10 * sVar13 * uVar33) +
                       fVar5 * *(float *)((long)pvVar17 + lVar39 + sVar15 * sVar16 * uVar33);
                  iVar37 = iVar37 + -1;
                  lVar39 = lVar39 + 4;
                } while (1 < iVar37);
              }
              uVar33 = uVar33 + 1;
            } while (uVar33 != uVar35);
          }
          pMVar34 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          uVar33 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar34 >> 3) *
                   -0x71c71c71c71c71c7;
          if (2 < uVar33) {
            pp_Var19 = this->_vptr_Eltwise_x86_avx;
            uVar36 = 2;
            do {
              if (0 < (int)uVar7) {
                pMVar4 = pMVar34 + uVar36;
                fVar5 = *(float *)(*(long *)(&this->field_0xd8 + (long)pp_Var19[-3]) + uVar36 * 4);
                uVar38 = 0;
                do {
                  if (0 < iVar41) {
                    lVar39 = this_00->cstep * this_00->elemsize * uVar38;
                    pvVar12 = this_00->data;
                    sVar9 = pMVar4->cstep;
                    sVar10 = pMVar4->elemsize;
                    pvVar14 = pMVar4->data;
                    lVar40 = 0;
                    iVar37 = iVar41 + 1;
                    do {
                      *(float *)((long)pvVar12 + lVar40 + lVar39) =
                           fVar5 * *(float *)((long)pvVar14 + lVar40 + sVar9 * sVar10 * uVar38) +
                           *(float *)((long)pvVar12 + lVar40 + lVar39);
                      iVar37 = iVar37 + -1;
                      lVar40 = lVar40 + 4;
                    } while (1 < iVar37);
                  }
                  uVar38 = uVar38 + 1;
                } while (uVar38 != uVar35);
              }
              uVar36 = uVar36 + 1;
            } while (uVar36 != uVar33);
          }
        }
      }
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86_avx[-3]) != 2) {
        return 0;
      }
      if (0 < (int)uVar7) {
        pMVar34 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar33 = 0;
        do {
          if (0 < iVar41) {
            sVar9 = this_00->cstep;
            sVar10 = pMVar34[1].cstep;
            sVar11 = this_00->elemsize;
            pvVar12 = this_00->data;
            sVar13 = pMVar34[1].elemsize;
            pvVar14 = pMVar34[1].data;
            sVar15 = m->cstep;
            sVar16 = m->elemsize;
            pvVar17 = m->data;
            lVar39 = 0;
            iVar37 = iVar41 + 1;
            do {
              auVar42 = vmaxss_avx(ZEXT416(*(uint *)((long)pvVar14 +
                                                    lVar39 + sVar10 * sVar13 * uVar33)),
                                   ZEXT416(*(uint *)((long)pvVar17 +
                                                    lVar39 + sVar15 * sVar16 * uVar33)));
              *(int *)((long)pvVar12 + lVar39 + sVar9 * sVar11 * uVar33) = auVar42._0_4_;
              iVar37 = iVar37 + -1;
              lVar39 = lVar39 + 4;
            } while (1 < iVar37);
          }
          uVar33 = uVar33 + 1;
        } while (uVar33 != uVar35);
      }
      pMVar34 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar33 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar34 >> 3) *
               -0x71c71c71c71c71c7;
      if (uVar33 < 3) {
        return 0;
      }
      uVar36 = 2;
      do {
        if (0 < (int)uVar7) {
          pMVar4 = pMVar34 + uVar36;
          uVar38 = 0;
          do {
            if (0 < iVar41) {
              lVar39 = this_00->cstep * this_00->elemsize * uVar38;
              pvVar12 = this_00->data;
              sVar9 = pMVar4->cstep;
              sVar10 = pMVar4->elemsize;
              pvVar14 = pMVar4->data;
              lVar40 = 0;
              iVar37 = iVar41 + 1;
              do {
                auVar42 = vmaxss_avx(ZEXT416(*(uint *)((long)pvVar12 + lVar40 + lVar39)),
                                     ZEXT416(*(uint *)((long)pvVar14 +
                                                      lVar40 + sVar9 * sVar10 * uVar38)));
                *(int *)((long)pvVar12 + lVar40 + lVar39) = auVar42._0_4_;
                iVar37 = iVar37 + -1;
                lVar40 = lVar40 + 4;
              } while (1 < iVar37);
            }
            uVar38 = uVar38 + 1;
          } while (uVar38 != uVar35);
        }
        uVar36 = uVar36 + 1;
      } while (uVar36 != uVar33);
    }
    return 0;
  }
  return -100;
}

Assistant:

int Eltwise_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (op_type == Operation_PROD)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
                }
            }
        }
        if (op_type == Operation_SUM)
        {
            if (coeffs.w == 0)
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr1);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        ptr1 += 8;
                        outptr += 8;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m256 _p = _mm256_loadu_ps(outptr);
                            __m256 _p1 = _mm256_loadu_ps(ptr);
                            _p = _mm256_add_ps(_p, _p1);
                            _mm256_storeu_ps(outptr, _p);

                            ptr += 8;
                            outptr += 8;
                        }
                    }
                }
            }
            else
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                __m256 _coeff0 = _mm256_set1_ps(coeffs[0]);
                __m256 _coeff1 = _mm256_set1_ps(coeffs[1]);
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr1);
                        _p = _mm256_mul_ps(_p, _coeff0);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff1, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        ptr1 += 8;
                        outptr += 8;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    __m256 _coeff = _mm256_set1_ps(coeffs[b]);
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m256 _p = _mm256_loadu_ps(outptr);
                            __m256 _p1 = _mm256_loadu_ps(ptr);
                            _p = _mm256_comp_fmadd_ps(_p1, _coeff, _p);
                            _mm256_storeu_ps(outptr, _p);

                            ptr += 8;
                            outptr += 8;
                        }
                    }
                }
            }
        }
        if (op_type == Operation_MAX)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_max_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (op_type == Operation_PROD)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_mul_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
                }
            }
        }
        if (op_type == Operation_SUM)
        {
            if (coeffs.w == 0)
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(ptr);
                        __m128 _p1 = _mm_load_ps(ptr1);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        ptr1 += 4;
                        outptr += 4;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m128 _p = _mm_load_ps(outptr);
                            __m128 _p1 = _mm_load_ps(ptr);
                            _p = _mm_add_ps(_p, _p1);
                            _mm_store_ps(outptr, _p);

                            ptr += 4;
                            outptr += 4;
                        }
                    }
                }
            }
            else
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                __m128 _coeff0 = _mm_set1_ps(coeffs[0]);
                __m128 _coeff1 = _mm_set1_ps(coeffs[1]);
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(ptr);
                        __m128 _p1 = _mm_load_ps(ptr1);
                        _p = _mm_mul_ps(_p, _coeff0);
                        _p1 = _mm_mul_ps(_p1, _coeff1);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        ptr1 += 4;
                        outptr += 4;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    __m128 _coeff = _mm_set1_ps(coeffs[b]);
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m128 _p1 = _mm_load_ps(ptr);
                            __m128 _p = _mm_load_ps(outptr);
                            _p1 = _mm_mul_ps(_p1, _coeff);
                            _p = _mm_add_ps(_p1, _p);
                            _mm_store_ps(outptr, _p);

                            ptr += 4;
                            outptr += 4;
                        }
                    }
                }
            }
        }
        if (op_type == Operation_MAX)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_max_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);
            int remain = size;
            for (; remain > 0; remain--)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;

                for (; remain > 0; remain--)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;

                for (; remain > 0; remain--)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int remain = size;
                    for (; remain > 0; remain--)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            float coeff0 = coeffs[0];
            float coeff1 = coeffs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;
                for (; remain > 0; remain--)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                float coeff = coeffs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int remain = size;
                    for (; remain > 0; remain--)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int remain = size;
            for (; remain > 0; remain--)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int remain = size;
                for (; remain > 0; remain--)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}